

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<wabt::(anonymous_namespace)::Newline,char_const(&)[33],std::__cxx11::string,char_const(&)[13],wabt::(anonymous_namespace)::OpenBrace>
          (CWriter *this,Newline *t,char (*u) [33],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          char (*args_1) [13],OpenBrace *args_2)

{
  size_t size;
  
  anon_unknown_0::CWriter::Write();
  size = strlen((char *)t);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,(char *)t,size);
  Write<std::__cxx11::string,char_const(&)[13],wabt::(anonymous_namespace)::OpenBrace>
            (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)u,
             (char (*) [13])" *instance) ",(OpenBrace *)args);
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }